

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::stringify<C_A_T_C_H_T_E_S_T_160()::t1>
          (string *__return_storage_ptr__,Detail *this,t1 *e)

{
  ReusableStringStream rss;
  Detail local_31;
  ReusableStringStream local_30;
  
  ReusableStringStream::ReusableStringStream(&local_30);
  local_31 = *this;
  std::__ostream_insert<char,std::char_traits<char>>(local_30.m_oss,(char *)&local_31,1);
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_30);
  ReusableStringStream::~ReusableStringStream(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<typename std::remove_cv<typename std::remove_reference<T>::type>::type>::convert(e);
        }